

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::GenerateTargetInstallRules
          (cmLocalGenerator *this,ostream *os,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurationTypes)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__return_storage_ptr__;
  bool bVar1;
  byte bVar2;
  TargetType TVar3;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *this_00;
  reference ppcVar4;
  char *pcVar5;
  ulong uVar6;
  string *psVar7;
  undefined1 local_530 [8];
  cmInstallScriptGenerator g_3;
  string local_438;
  char *local_418;
  char *postinstall;
  cmInstallTargetGeneratorLocal g_2;
  cmInstallTargetGeneratorLocal g_1;
  undefined1 local_1c0 [8];
  string destination;
  undefined1 local_180 [8];
  cmInstallScriptGenerator g;
  allocator<char> local_79;
  string local_78;
  char *local_58;
  char *preinstall;
  cmGeneratorTarget *l;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__range1;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *tgts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurationTypes_local;
  string *config_local;
  ostream *os_local;
  cmLocalGenerator *this_local;
  
  this_00 = GetGeneratorTargets(this);
  __end1 = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin(this_00);
  l = (cmGeneratorTarget *)
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end(this_00);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                                *)&l);
    if (!bVar1) {
      return;
    }
    ppcVar4 = __gnu_cxx::
              __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
              ::operator*(&__end1);
    preinstall = (char *)*ppcVar4;
    TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)preinstall);
    pcVar5 = preinstall;
    if (TVar3 != INTERFACE_LIBRARY) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"PRE_INSTALL_SCRIPT",&local_79);
      pcVar5 = cmGeneratorTarget::GetProperty((cmGeneratorTarget *)pcVar5,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
      local_58 = pcVar5;
      if (pcVar5 != (char *)0x0) {
        cmInstallScriptGenerator::cmInstallScriptGenerator
                  ((cmInstallScriptGenerator *)local_180,pcVar5,false,(char *)0x0,false);
        cmScriptGenerator::Generate((cmScriptGenerator *)local_180,os,config,configurationTypes);
        cmInstallScriptGenerator::~cmInstallScriptGenerator((cmInstallScriptGenerator *)local_180);
      }
      cmTarget::GetInstallPath_abi_cxx11_
                ((string *)((long)&destination.field_2 + 8),*(cmTarget **)preinstall);
      bVar2 = std::__cxx11::string::empty();
      std::__cxx11::string::~string((string *)(destination.field_2._M_local_buf + 8));
      if (((bVar2 ^ 0xff) & 1) != 0) {
        __return_storage_ptr__ =
             &g_1.super_cmInstallTargetGenerator.Backtrace.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
        cmTarget::GetInstallPath_abi_cxx11_
                  ((string *)__return_storage_ptr__,*(cmTarget **)preinstall);
        std::__cxx11::string::substr((ulong)local_1c0,(ulong)__return_storage_ptr__);
        std::__cxx11::string::~string
                  ((string *)
                   &g_1.super_cmInstallTargetGenerator.Backtrace.TopEntry.
                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        cmsys::SystemTools::ConvertToUnixSlashes((string *)local_1c0);
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) != 0) {
          std::__cxx11::string::operator=((string *)local_1c0,".");
        }
        TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)preinstall);
        if (TVar3 < SHARED_LIBRARY) {
LAB_004ab632:
          psVar7 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)preinstall);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmInstallTargetGeneratorLocal::cmInstallTargetGeneratorLocal
                    ((cmInstallTargetGeneratorLocal *)
                     &g_2.super_cmInstallTargetGenerator.Backtrace.TopEntry.
                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,this,psVar7,pcVar5,false);
          cmScriptGenerator::Generate
                    ((cmScriptGenerator *)
                     &g_2.super_cmInstallTargetGenerator.Backtrace.TopEntry.
                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,os,config,configurationTypes);
          cmInstallTargetGeneratorLocal::~cmInstallTargetGeneratorLocal
                    ((cmInstallTargetGeneratorLocal *)
                     &g_2.super_cmInstallTargetGenerator.Backtrace.TopEntry.
                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
        }
        else if (TVar3 == SHARED_LIBRARY) {
          psVar7 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)preinstall);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmInstallTargetGeneratorLocal::cmInstallTargetGeneratorLocal
                    ((cmInstallTargetGeneratorLocal *)&postinstall,this,psVar7,pcVar5,false);
          cmScriptGenerator::Generate
                    ((cmScriptGenerator *)&postinstall,os,config,configurationTypes);
          cmInstallTargetGeneratorLocal::~cmInstallTargetGeneratorLocal
                    ((cmInstallTargetGeneratorLocal *)&postinstall);
        }
        else if (TVar3 == MODULE_LIBRARY) goto LAB_004ab632;
        std::__cxx11::string::~string((string *)local_1c0);
      }
      pcVar5 = preinstall;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_438,"POST_INSTALL_SCRIPT",(allocator<char> *)&g_3.field_0xef);
      pcVar5 = cmGeneratorTarget::GetProperty((cmGeneratorTarget *)pcVar5,&local_438);
      std::__cxx11::string::~string((string *)&local_438);
      std::allocator<char>::~allocator((allocator<char> *)&g_3.field_0xef);
      local_418 = pcVar5;
      if (pcVar5 != (char *)0x0) {
        cmInstallScriptGenerator::cmInstallScriptGenerator
                  ((cmInstallScriptGenerator *)local_530,pcVar5,false,(char *)0x0,false);
        cmScriptGenerator::Generate((cmScriptGenerator *)local_530,os,config,configurationTypes);
        cmInstallScriptGenerator::~cmInstallScriptGenerator((cmInstallScriptGenerator *)local_530);
      }
    }
    __gnu_cxx::
    __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void cmLocalGenerator::GenerateTargetInstallRules(
  std::ostream& os, const std::string& config,
  std::vector<std::string> const& configurationTypes)
{
  // Convert the old-style install specification from each target to
  // an install generator and run it.
  const std::vector<cmGeneratorTarget*>& tgts = this->GetGeneratorTargets();
  for (cmGeneratorTarget* l : tgts) {
    if (l->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }

    // Include the user-specified pre-install script for this target.
    if (const char* preinstall = l->GetProperty("PRE_INSTALL_SCRIPT")) {
      cmInstallScriptGenerator g(preinstall, false, nullptr, false);
      g.Generate(os, config, configurationTypes);
    }

    // Install this target if a destination is given.
    if (!l->Target->GetInstallPath().empty()) {
      // Compute the full install destination.  Note that converting
      // to unix slashes also removes any trailing slash.
      // We also skip over the leading slash given by the user.
      std::string destination = l->Target->GetInstallPath().substr(1);
      cmSystemTools::ConvertToUnixSlashes(destination);
      if (destination.empty()) {
        destination = ".";
      }

      // Generate the proper install generator for this target type.
      switch (l->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY: {
          // Use a target install generator.
          cmInstallTargetGeneratorLocal g(this, l->GetName(),
                                          destination.c_str(), false);
          g.Generate(os, config, configurationTypes);
        } break;
        case cmStateEnums::SHARED_LIBRARY: {
#if defined(_WIN32) || defined(__CYGWIN__)
          // Special code to handle DLL.  Install the import library
          // to the normal destination and the DLL to the runtime
          // destination.
          cmInstallTargetGeneratorLocal g1(this, l->GetName(),
                                           destination.c_str(), true);
          g1.Generate(os, config, configurationTypes);
          // We also skip over the leading slash given by the user.
          destination = l->Target->GetRuntimeInstallPath().substr(1);
          cmSystemTools::ConvertToUnixSlashes(destination);
          cmInstallTargetGeneratorLocal g2(this, l->GetName(),
                                           destination.c_str(), false);
          g2.Generate(os, config, configurationTypes);
#else
          // Use a target install generator.
          cmInstallTargetGeneratorLocal g(this, l->GetName(),
                                          destination.c_str(), false);
          g.Generate(os, config, configurationTypes);
#endif
        } break;
        default:
          break;
      }
    }

    // Include the user-specified post-install script for this target.
    if (const char* postinstall = l->GetProperty("POST_INSTALL_SCRIPT")) {
      cmInstallScriptGenerator g(postinstall, false, nullptr, false);
      g.Generate(os, config, configurationTypes);
    }
  }
}